

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_visit_fields_test.cc
# Opt level: O0

size_t google::protobuf::internal::(anonymous_namespace)::
       MapValueByteSizeLong<google::protobuf::internal::MapDynamicFieldMessageValueInfo<google::protobuf::MapValueRef_const>>
                 (Type type,
                 MapDynamicFieldMessageValueInfo<const_google::protobuf::MapValueRef> info)

{
  Type *v1;
  Type *v2;
  char *failure_msg;
  LogMessage *pLVar1;
  Message *value;
  size_t sVar2;
  LogMessage local_38;
  Voidify local_25;
  Type local_24;
  Nullable<const_char_*> local_20;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  MapDynamicFieldMessageValueInfo<const_google::protobuf::MapValueRef> MStack_10;
  Type type_local;
  MapDynamicFieldMessageValueInfo<const_google::protobuf::MapValueRef> info_local;
  
  absl_log_internal_check_op_result._4_4_ = type;
  MStack_10.value = info.value;
  v1 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>
                 ((Type *)((long)&absl_log_internal_check_op_result + 4));
  local_24 = TYPE_GROUP;
  v2 = absl::lts_20250127::log_internal::
       GetReferenceableValue<google::protobuf::internal::FieldDescriptorLite::Type>(&local_24);
  local_20 = absl::lts_20250127::log_internal::
             Check_NEImpl<google::protobuf::internal::FieldDescriptorLite::Type,google::protobuf::internal::FieldDescriptorLite::Type>
                       (v1,v2,"type != FieldDescriptor::TYPE_GROUP");
  if (local_20 != (Nullable<const_char_*>)0x0) {
    failure_msg = absl::lts_20250127::implicit_cast<char_const*>(local_20);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/reflection_visit_fields_test.cc"
               ,0xea,failure_msg);
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_38);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_25,pLVar1);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  value = MapDynamicFieldMessageValueInfo<const_google::protobuf::MapValueRef>::Get
                    (&stack0xfffffffffffffff0);
  sVar2 = WireFormatLite::MessageSize<google::protobuf::Message>(value);
  return sVar2;
}

Assistant:

inline size_t MapValueByteSizeLong(FieldDescriptor::Type type, InfoT info) {
  // There is a bug in GCC 9.5 where if-constexpr arguments are not understood
  // if passed into a helper function. A reproduction of the bug can be found
  // at: https://godbolt.org/z/65qW3vGhP
  // This is fixed in GCC 10.1+.
  (void)type;  // Suppress -Wunused-but-set-parameter

  if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_STRING) {
    return WireFormatLite::StringSize(info.Get());
  } else if constexpr (info.cpp_type == FieldDescriptor::CPPTYPE_MESSAGE) {
    ABSL_CHECK_NE(type, FieldDescriptor::TYPE_GROUP);
    return WireFormatLite::MessageSize(info.Get());
  } else {
    return MapPrimitiveFieldByteSize<info.cpp_type>(type, info.Get());
  }
}